

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

VarSymbol * __thiscall VarTable::cSearch(VarTable *this,char *lexeme)

{
  bool bVar1;
  int iVar2;
  VarSymbol *this_00;
  
  if (lexeme != (char *)0x0) {
    for (this_00 = (VarSymbol *)SymbolTable::cSearch(&this->super_SymbolTable,lexeme);
        (this_00 != (VarSymbol *)0x0 &&
        ((this_00->super_Symbol).scope <= (this->super_SymbolTable).currentScope));
        this_00 = (VarSymbol *)(this_00->super_Symbol).nextSymbol) {
      iVar2 = strcmp((this->super_SymbolTable).lexemeArray + (this_00->super_Symbol).lexemeIndex,
                     lexeme);
      if ((iVar2 == 0) &&
         (bVar1 = Symbol::isScope(&this_00->super_Symbol,
                                  (this->super_SymbolTable).currentScopeLexeme), bVar1)) {
        return this_00;
      }
      bVar1 = Symbol::isScope(&this_00->super_Symbol,(this->super_SymbolTable).previousScopeLexeme);
      if (bVar1) {
        return this_00;
      }
      bVar1 = Symbol::isScope(&this_00->super_Symbol,"nonLocal");
      if (bVar1) {
        return this_00;
      }
    }
  }
  return (VarSymbol *)0x0;
}

Assistant:

VarSymbol *VarTable::cSearch(const char *lexeme) {
    if (lexeme != NULL) {
        VarSymbol *varSymbol = (VarSymbol *) SymbolTable::cSearch(lexeme);
        while (varSymbol != NULL && varSymbol->getScope() <= currentScope) {
            if ((!strcmp(lexemeArray + varSymbol->getLexemeIndex(), lexeme) &&
                 varSymbol->isScope(currentScopeLexeme)) ||
                varSymbol->isScope(previousScopeLexeme) || varSymbol->isScope("nonLocal")) {
                return varSymbol;
            }
            varSymbol = (VarSymbol *) varSymbol->getNextSymbol();
        }
    }
    return NULL;
}